

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_dup(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue JVar1;
  int iVar2;
  ssize_t sVar3;
  undefined8 in_RDX;
  JSContext *in_RSI;
  int32_t *in_RDI;
  int ret;
  int fd;
  undefined4 local_5c;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 local_28;
  undefined4 uStack_c;
  
  val.tag._0_4_ = in_stack_ffffffffffffffd0;
  val.u = (JSValueUnion)in_RDX;
  val.tag._4_4_ = in_stack_ffffffffffffffd4;
  iVar2 = JS_ToInt32(in_RSI,in_RDI,val);
  if (iVar2 == 0) {
    dup(local_5c);
    sVar3 = js_get_errno(0x1187f0);
    uVar4 = (undefined4)sVar3;
    local_28 = 0;
    in_stack_ffffffffffffffd4 = uStack_c;
  }
  else {
    uVar4 = 0;
    local_28 = 6;
  }
  JVar1.u._4_4_ = in_stack_ffffffffffffffd4;
  JVar1.u.int32 = uVar4;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_os_dup(JSContext *ctx, JSValueConst this_val,
                         int argc, JSValueConst *argv)
{
    int fd, ret;
    
    if (JS_ToInt32(ctx, &fd, argv[0]))
        return JS_EXCEPTION;
    ret = js_get_errno(dup(fd));
    return JS_NewInt32(ctx, ret);
}